

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O1

string * __thiscall
t_c_glib_generator::type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_c_glib_generator *this,t_type *ttype,bool in_typedef,
          bool is_const)

{
  _func_int **pp_Var1;
  t_program *this_00;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  t_type *ptVar5;
  runtime_error *this_01;
  ulong *puVar6;
  char *pcVar7;
  t_c_glib_generator *this_02;
  string pname;
  string local_90;
  undefined1 local_70 [32];
  undefined1 local_50 [32];
  
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if ((char)iVar3 != '\0') {
    base_type_name_abi_cxx11_(&local_90,this,ttype);
    if (is_const) {
      std::operator+(__return_storage_ptr__,"const ",&local_90);
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == &local_90.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_90.field_2._M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_90.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_90._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_90.field_2._M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = local_90._M_string_length;
      local_90._M_string_length = 0;
      local_90.field_2._M_allocated_capacity =
           local_90.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_0013b06e;
  }
  iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
  if ((char)iVar3 == '\0') {
    this_00 = ttype->program_;
    if (this_00 == (t_program *)0x0) {
      local_70._0_8_ = local_70 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"");
    }
    else {
      local_50._0_8_ = local_50 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"c_glib","");
      t_program::get_namespace((string *)local_70,this_00,(string *)local_50);
    }
    iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               (local_70,*(ulong *)CONCAT44(extraout_var,iVar3));
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    puVar6 = (ulong *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_90.field_2._M_allocated_capacity = *puVar6;
      local_90.field_2._8_8_ = plVar4[3];
    }
    else {
      local_90.field_2._M_allocated_capacity = *puVar6;
      local_90._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_90._M_string_length = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    this_02 = (t_c_glib_generator *)local_70._0_8_;
    if ((t_c_glib_generator *)local_70._0_8_ != (t_c_glib_generator *)(local_70 + 0x10)) {
      operator_delete((void *)local_70._0_8_);
    }
    if ((this_00 != (t_program *)0x0) &&
       (this_02 = (t_c_glib_generator *)local_50._0_8_,
       (t_c_glib_generator *)local_50._0_8_ != (t_c_glib_generator *)(local_50 + 0x10))) {
      operator_delete((void *)local_50._0_8_);
    }
    bVar2 = is_complex_type(this_02,ttype);
    if (bVar2) {
      std::__cxx11::string::append((char *)&local_90);
    }
    if (!is_const) goto LAB_0013b167;
    std::operator+(__return_storage_ptr__,"const ",&local_90);
  }
  else {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_allocated_capacity =
         local_90.field_2._M_allocated_capacity & 0xffffffffffffff00;
    if (ttype[1].super_t_doc.doc_.field_2._M_local_buf[8] == '\x01') {
      pp_Var1 = ttype[1].super_t_doc._vptr_t_doc;
      local_70._0_8_ = (t_c_glib_generator *)(local_70 + 0x10);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,pp_Var1,
                 ttype[1].super_t_doc.doc_._M_dataplus._M_p + (long)pp_Var1);
      std::__cxx11::string::operator=((string *)&local_90,(string *)local_70);
      if ((t_c_glib_generator *)local_70._0_8_ != (t_c_glib_generator *)(local_70 + 0x10)) {
        operator_delete((void *)local_70._0_8_);
      }
    }
    else {
      iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
      if (((char)iVar3 == '\0') &&
         (iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype), (char)iVar3 == '\0')) {
        iVar3 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
        if ((char)iVar3 != '\0') {
          ptVar5 = t_type::get_true_type(*(t_type **)&ttype[1].super_t_doc.has_doc_);
          iVar3 = (*(ptVar5->super_t_doc)._vptr_t_doc[4])(ptVar5);
          if ((char)iVar3 != '\0') {
            this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (this_01,"compiler error: list element type cannot be void");
            __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          iVar3 = (*(ptVar5->super_t_doc)._vptr_t_doc[10])(ptVar5);
          if ((char)iVar3 == '\0') {
            iVar3 = (*(ptVar5->super_t_doc)._vptr_t_doc[5])(ptVar5);
            if ((char)iVar3 == '\0') {
              pcVar7 = "GPtrArray";
            }
            else {
              iVar3 = (*(ptVar5->super_t_doc)._vptr_t_doc[6])(ptVar5);
              pcVar7 = "GArray";
              if ((char)iVar3 != '\0') {
                pcVar7 = "GPtrArray";
              }
            }
          }
          else {
            pcVar7 = "GArray";
          }
          std::__cxx11::string::operator=((string *)&local_90,pcVar7);
        }
      }
      else {
        std::__cxx11::string::_M_replace
                  ((ulong)&local_90,0,(char *)local_90._M_string_length,0x379f3d);
      }
    }
    if (!in_typedef) {
      std::__cxx11::string::append((char *)&local_90);
    }
    if (is_const) {
      std::operator+(__return_storage_ptr__,"const ",&local_90);
    }
    else {
LAB_0013b167:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == &local_90.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_90.field_2._M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_90.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_90._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_90.field_2._M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = local_90._M_string_length;
      local_90._M_string_length = 0;
      local_90.field_2._M_allocated_capacity =
           local_90.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == &local_90.field_2) {
    return __return_storage_ptr__;
  }
LAB_0013b06e:
  operator_delete(local_90._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

string t_c_glib_generator::type_name(t_type* ttype, bool in_typedef, bool is_const) {
  if (ttype->is_base_type()) {
    string bname = base_type_name(ttype);

    if (is_const) {
      return "const " + bname;
    } else {
      return bname;
    }
  }

  if (ttype->is_container()) {
    string cname;

    t_container* tcontainer = (t_container*)ttype;
    if (tcontainer->has_cpp_name()) {
      cname = tcontainer->get_cpp_name();
    } else if (ttype->is_map()) {
      cname = "GHashTable";
    } else if (ttype->is_set()) {
      // since a set requires unique elements, use a GHashTable, and
      // populate the keys and values with the same data, using keys for
      // the actual writes and reads.
      // TODO: discuss whether or not to implement TSet, THashSet or GHashSet
      cname = "GHashTable";
    } else if (ttype->is_list()) {
      t_type* etype = get_true_type(((t_list*)ttype)->get_elem_type());
      if (etype->is_void()) {
        throw std::runtime_error("compiler error: list element type cannot be void");
      }
      // TODO: investigate other implementations besides GPtrArray
      cname = is_numeric(etype) ? "GArray" : "GPtrArray";
    }

    /* Omit the dereference operator if we are aliasing this type within a
       typedef, to allow the type to be used more naturally in client code;
       otherwise, include it */
    if (!in_typedef) {
      cname += " *";
    }

    if (is_const) {
      return "const " + cname;
    } else {
      return cname;
    }
  }

  // check for a namespace
  t_program* tprogram = ttype->get_program();
  string pname = (tprogram ? tprogram->get_namespace("c_glib") : "") + ttype->get_name();

  if (is_complex_type(ttype)) {
    pname += " *";
  }

  if (is_const) {
    return "const " + pname;
  } else {
    return pname;
  }
}